

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O3

BaseState<false> * __thiscall
ArrayToVectorState<false,_unsigned_int>::Uint
          (ArrayToVectorState<false,_unsigned_int> *this,Context<false> *param_1,uint f)

{
  pointer *ppuVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  iterator __position;
  uint local_c;
  
  this_00 = this->output_array;
  __position._M_current =
       (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_c = f;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (this_00,__position,&local_c);
  }
  else {
    *__position._M_current = f;
    ppuVar1 = &(this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  return &this->super_BaseState<false>;
}

Assistant:

BaseState<audit>* Uint(Context<audit>& /* ctx */, unsigned f)
  {
    output_array->push_back((T)f);
    return this;
  }